

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O3

ssize_t __thiscall ChacoGraph::read(ChacoGraph *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *psVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  float fVar11;
  uint nv;
  uint fmt;
  double w;
  uint ne;
  uint j;
  int n;
  ostringstream ss;
  string message;
  uint uStack_10240;
  int iStack_1023c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10218;
  undefined1 auStack_101f4 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_101f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_101d0;
  ostringstream aoStack_101b0 [376];
  char acStack_10038 [65544];
  
  pcVar4 = fgets(acStack_10038,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
  if (pcVar4 == (char *)0x0) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar6 = psVar6 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar6,"file is empty","");
    __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar1 = false;
  iVar2 = sscanf(acStack_10038,"%u%u%u",&uStack_10240,auStack_101f4,&iStack_1023c);
  if (iVar2 != 2) {
    if (iVar2 != 3) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      *(string **)psVar6 = psVar6 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>(psVar6,"invalid first line in graph file","");
      __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    if (iStack_1023c == 0) {
      bVar1 = false;
    }
    else {
      if (iStack_1023c != 1) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar6 = psVar6 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>(psVar6,"invalid graph format specifier","");
        __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      bVar1 = true;
    }
  }
  if (uStack_10240 != 0) {
    uVar10 = 1;
    do {
      uVar3 = Gecko::Graph::insert_node(1.0);
      if (uVar3 != uVar10) {
        std::__cxx11::ostringstream::ostringstream(aoStack_101b0);
        std::ostream::_M_insert<unsigned_long>((ulong)aoStack_101b0);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        std::operator+(pbVar8,"cannot insert node",&bStack_10238);
        __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      do {
        pcVar4 = fgets(acStack_10038,0x10000,(FILE *)CONCAT44(in_register_00000034,__fd));
        if (pcVar4 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(aoStack_101b0);
          std::ostream::_M_insert<unsigned_long>((ulong)aoStack_101b0);
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          std::operator+(pbVar8,"no data for node",&bStack_10238);
          __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      } while ((acStack_10038[0] == '%') || (acStack_10038[0] == '#'));
      iVar2 = sscanf(acStack_10038,"%u%n",&bStack_101f0,&bStack_101d0);
      if (iVar2 == 1) {
        uVar9 = 0;
        do {
          uVar3 = (uint)uVar9;
          bStack_10218._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          if (bVar1) {
            uVar3 = uVar3 + (int)bStack_101d0._M_dataplus._M_p;
            iVar2 = sscanf(acStack_10038 + uVar3,"%lf%n",&bStack_10218,&bStack_101d0);
            if (iVar2 != 1) {
              std::__cxx11::ostringstream::ostringstream(aoStack_101b0);
              std::ostream::_M_insert<unsigned_long>((ulong)aoStack_101b0);
              pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::__cxx11::stringbuf::str();
              std::operator+(pbVar8,"cannot read weight for node",&bStack_10238);
              __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            fVar11 = (float)(double)bStack_10218._M_dataplus._M_p;
          }
          else {
            fVar11 = 1.0;
          }
          iVar2 = Gecko::Graph::insert_arc((uint)this,uVar10,fVar11,fVar11);
          if (iVar2 == 0) {
            psVar6 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar6 = psVar6 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>(psVar6,"arc insertion failed","");
            __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar9 = (ulong)(uVar3 + (int)bStack_101d0._M_dataplus._M_p);
          iVar2 = sscanf(acStack_10038 + uVar9,"%u%n",&bStack_101f0,&bStack_101d0);
        } while (iVar2 == 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 <= uStack_10240);
  }
  uVar5 = Gecko::Graph::directed();
  if ((int)uVar5 == 0) {
    return CONCAT71((int7)((ulong)uVar5 >> 8),1);
  }
  Gecko::Graph::arc_source((uint)this);
  std::__cxx11::ostringstream::ostringstream(aoStack_101b0);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_101b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  bStack_10218._M_dataplus._M_p = (pointer)&bStack_10218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_10218,"no arc (","");
  std::__cxx11::stringbuf::str();
  std::operator+(&bStack_10238,&bStack_10218,&bStack_101d0);
  bStack_101f0._M_dataplus._M_p = (pointer)&bStack_101f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_101f0,"): graph is directed","")
  ;
  std::operator+(pbVar8,&bStack_10238,&bStack_101f0);
  __cxa_throw(pbVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool
ChacoGraph::read(FILE* file)
{
  try {
    char line[0x10000];
    if (!fgets(line, sizeof(line), file))
      throw std::string("file is empty");

    // determine number of nodes, edges, and type of graph
    unsigned int nv, ne, fmt;
    bool weighted = false;
    switch (sscanf(line, "%u%u%u", &nv, &ne, &fmt)) {
      case 2:
        break;
      case 3:
        switch (fmt) {
          case 0:
            break;
          case 1:
            weighted = true;
            break;
          default:
            throw std::string("invalid graph format specifier");
        }
        break;
      default:
        throw std::string("invalid first line in graph file");
    }

    // read nodes and their neighbors
    for (Node::Index i = 1; i <= nv; i++) {
      if (insert_node() != i) {
        std::ostringstream ss;
        ss << i;
        throw std::string("cannot insert node" + ss.str());
      }
      do {
        if (!fgets(line, sizeof(line), file)) {
          std::ostringstream ss;
          ss << i;
          throw std::string("no data for node" + ss.str());
        }
      } while (line[0] == '%' || line[0] == '#');
      int n;
      for (unsigned int k = 0, j; sscanf(line + k, "%u%n", &j, &n) == 1; k += n) {
        double w = 1;
        if (weighted) {
          k += n;
          if (sscanf(line + k, "%lf%n", &w, &n) != 1) {
            std::ostringstream ss;
            ss << i;
            throw std::string("cannot read weight for node" + ss.str());
          }
        }
        if (!insert_arc(i, j, Float(w), Float(w)))
          throw std::string("arc insertion failed");
      }
    }

    // make sure graph is undirected
    Arc::Index a = directed();
    if (a) {
      Node::Index i = arc_source(a);
      Node::Index j = arc_target(a);
      std::ostringstream ss;
      ss << i << ", " << j;
      throw std::string("no arc (") + ss.str() + std::string("): graph is directed");
    }
  }
  catch (std::string message) {
    std::cerr << "ERROR: " << message << std::endl;
    return false;
  }

  return true;
}